

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

void __thiscall
wallet::LegacyScriptPubKeyMan::ReturnDestination
          (LegacyScriptPubKeyMan *this,int64_t nIndex,bool fInternal,CTxDestination *param_3)

{
  mapped_type mVar1;
  mapped_type *__k;
  mapped_type *pmVar2;
  long lVar3;
  undefined7 in_register_00000011;
  long lVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock44;
  mapped_type local_40;
  unique_lock<std::recursive_mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = nIndex;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_38,
             &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x580,false);
  lVar3 = 0x2c0;
  if ((this->super_LegacyDataSPKM).set_pre_split_keypool._M_t._M_impl.super__Rb_tree_header.
      _M_node_count == 0) {
    lVar3 = 0x290;
  }
  lVar4 = 0x260;
  if ((int)CONCAT71(in_register_00000011,fInternal) == 0) {
    lVar4 = lVar3;
  }
  std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
  _M_insert_unique<long_const&>
            ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
             ((long)&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan +
             lVar4),&local_40);
  __k = std::map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>::at
                  (&this->m_index_to_reserved_key,&local_40);
  mVar1 = local_40;
  pmVar2 = std::
           map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>::
           operator[](&(this->super_LegacyDataSPKM).m_pool_key_to_index,__k);
  *pmVar2 = mVar1;
  std::
  _Rb_tree<long,_std::pair<const_long,_CKeyID>,_std::_Select1st<std::pair<const_long,_CKeyID>_>,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>
  ::erase(&(this->m_index_to_reserved_key)._M_t,&local_40);
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::operator()(&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.NotifyCanGetAddressesChanged);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
  ScriptPubKeyMan::WalletLogPrintf<long>((ScriptPubKeyMan *)this,"keypool return %d\n",local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::ReturnDestination(int64_t nIndex, bool fInternal, const CTxDestination&)
{
    // Return to key pool
    {
        LOCK(cs_KeyStore);
        if (fInternal) {
            setInternalKeyPool.insert(nIndex);
        } else if (!set_pre_split_keypool.empty()) {
            set_pre_split_keypool.insert(nIndex);
        } else {
            setExternalKeyPool.insert(nIndex);
        }
        CKeyID& pubkey_id = m_index_to_reserved_key.at(nIndex);
        m_pool_key_to_index[pubkey_id] = nIndex;
        m_index_to_reserved_key.erase(nIndex);
        NotifyCanGetAddressesChanged();
    }
    WalletLogPrintf("keypool return %d\n", nIndex);
}